

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O3

bool __thiscall SharedMemoryManager::RemoveShMem(SharedMemoryManager *this)

{
  int iVar1;
  
  if (0 < this->total_attached_) {
    return false;
  }
  iVar1 = shmctl(this->sh_mem_id_,0,(shmid_ds *)0x0);
  return iVar1 != -1;
}

Assistant:

bool SharedMemoryManager::RemoveShMem()
{            
    if(total_attached_ > 0 ) {
        DEBUG_ELOG("Error : attached exists :" <<total_attached_ );
		return false;
    }
    if (shmctl(sh_mem_id_, IPC_RMID, (struct shmid_ds *)NULL) == -1) {
        DEBUG_ELOG("Remove shared memoey error: "<< strerror(errno) );
		return false;
    }
    return true;
}